

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int saveCursorPosition(BtCursor *pCur)

{
  int iVar1;
  
  if (pCur->eState == '\x02') {
    pCur->eState = '\x01';
  }
  else {
    pCur->skipNext = 0;
  }
  iVar1 = saveCursorKey(pCur);
  if (iVar1 == 0) {
    btreeReleaseAllCursorPages(pCur);
    pCur->eState = '\x03';
  }
  pCur->curFlags = pCur->curFlags & 0xf1;
  return iVar1;
}

Assistant:

static int saveCursorPosition(BtCursor *pCur){
  int rc;

  assert( CURSOR_VALID==pCur->eState || CURSOR_SKIPNEXT==pCur->eState );
  assert( 0==pCur->pKey );
  assert( cursorHoldsMutex(pCur) );

  if( pCur->eState==CURSOR_SKIPNEXT ){
    pCur->eState = CURSOR_VALID;
  }else{
    pCur->skipNext = 0;
  }

  rc = saveCursorKey(pCur);
  if( rc==SQLITE_OK ){
    btreeReleaseAllCursorPages(pCur);
    pCur->eState = CURSOR_REQUIRESEEK;
  }

  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl|BTCF_AtLast);
  return rc;
}